

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_q4_K(block_q4_K *x,float *y,int64_t k)

{
  long in_RDX;
  float *in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  int l_1;
  int l;
  float m2;
  float d2;
  float m1;
  float d1;
  int j;
  uint8_t m;
  uint8_t sc;
  int is;
  float min;
  float d;
  uint8_t *q;
  int i;
  int nb;
  int local_54;
  int local_50;
  int local_3c;
  byte local_36;
  byte local_35;
  int local_34;
  float local_30;
  float local_2c;
  long local_28;
  int local_20;
  int local_1c;
  float *local_10;
  long local_8;
  
  local_1c = (int)(in_RDX / 0x100);
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    local_28 = local_8 + (long)local_20 * 0x90 + 0x10;
    local_2c = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_8 + (long)local_20 * 0x90));
    local_30 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_8 + (long)local_20 * 0x90 + 2));
    local_34 = 0;
    for (local_3c = 0; local_3c < 0x100; local_3c = local_3c + 0x40) {
      get_scale_min_k4(local_34,(uint8_t *)(local_8 + (long)local_20 * 0x90 + 4),&local_35,&local_36
                      );
      fVar1 = local_2c * (float)local_35;
      fVar2 = local_30 * (float)local_36;
      get_scale_min_k4(local_34 + 1,(uint8_t *)(local_8 + (long)local_20 * 0x90 + 4),&local_35,
                       &local_36);
      for (local_50 = 0; local_50 < 0x20; local_50 = local_50 + 1) {
        *local_10 = fVar1 * (float)(*(byte *)(local_28 + local_50) & 0xf) + -fVar2;
        local_10 = local_10 + 1;
      }
      for (local_54 = 0; local_54 < 0x20; local_54 = local_54 + 1) {
        *local_10 = local_2c * (float)local_35 *
                    (float)((int)(uint)*(byte *)(local_28 + local_54) >> 4) +
                    -(local_30 * (float)local_36);
        local_10 = local_10 + 1;
      }
      local_28 = local_28 + 0x20;
      local_34 = local_34 + 2;
    }
  }
  return;
}

Assistant:

void dequantize_row_q4_K(const block_q4_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const uint8_t * q = x[i].qs;

        const float d   = GGML_FP16_TO_FP32(x[i].d);
        const float min = GGML_FP16_TO_FP32(x[i].dmin);

        int is = 0;
        uint8_t sc, m;
        for (int j = 0; j < QK_K; j += 64) {
            get_scale_min_k4(is + 0, x[i].scales, &sc, &m);
            const float d1 = d * sc; const float m1 = min * m;
            get_scale_min_k4(is + 1, x[i].scales, &sc, &m);
            const float d2 = d * sc; const float m2 = min * m;
            for (int l = 0; l < 32; ++l) *y++ = d1 * (q[l] & 0xF) - m1;
            for (int l = 0; l < 32; ++l) *y++ = d2 * (q[l]  >> 4) - m2;
            q += 32; is += 2;
        }
    }
}